

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxFixedValue<float>,duckdb::MinMaxFixedValue<int>,duckdb::GreaterThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  data_ptr_t pdVar1;
  BinaryAggregateHeap<int,_float,_duckdb::GreaterThan> *this;
  data_ptr_t pdVar2;
  idx_t size;
  Vector *pVVar3;
  ulong uVar4;
  STORAGE_TYPE *pSVar5;
  idx_t iVar6;
  long lVar7;
  idx_t iVar8;
  idx_t i_1;
  ulong uVar9;
  UnifiedVectorFormat state_format;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(state_vector,count,&local_78);
  FlatVector::VerifyFlatVector(result);
  size = ListVector::GetListSize(result);
  lVar7 = 0;
  for (iVar6 = 0; count != iVar6; iVar6 = iVar6 + 1) {
    iVar8 = iVar6;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      iVar8 = (idx_t)(local_78.sel)->sel_vector[iVar6];
    }
    lVar7 = lVar7 + *(long *)(*(long *)(local_78.data + iVar8 * 8) + 0x10);
  }
  ListVector::Reserve(result,lVar7 + size);
  pdVar1 = result->data;
  pVVar3 = ListVector::GetEntry(result);
  for (uVar9 = 0; uVar9 != count; uVar9 = uVar9 + 1) {
    uVar4 = uVar9;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(local_78.sel)->sel_vector[uVar9];
    }
    this = *(BinaryAggregateHeap<int,_float,_duckdb::GreaterThan> **)(local_78.data + uVar4 * 8);
    if (((char)this[1].capacity == '\x01') && (iVar6 = this->size, iVar6 != 0)) {
      lVar7 = (uVar9 + offset) * 0x10;
      *(idx_t *)(pdVar1 + lVar7) = size;
      *(idx_t *)(pdVar1 + lVar7 + 8) = iVar6;
      pSVar5 = BinaryAggregateHeap<int,_float,_duckdb::GreaterThan>::SortAndGetHeap(this);
      iVar6 = this->size;
      pdVar2 = pVVar3->data;
      for (iVar8 = 0; iVar6 != iVar8; iVar8 = iVar8 + 1) {
        *(float *)(pdVar2 + iVar8 * 4 + size * 4) = pSVar5[iVar8].second.value;
      }
      size = size + iVar8;
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,uVar9 + offset);
    }
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}